

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall boost::runtime::cla::parser::usage(parser *this,ostream *ostr,cstring *param_name)

{
  mapped_type *pmVar1;
  size_t sVar2;
  type pbVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  trie_ptr local_f8;
  shared_ptr<boost::runtime::basic_param> local_e8;
  cstring local_d8;
  pointer local_c8;
  pointer local_c0;
  cstring local_b8;
  locate_result local_a8;
  
  if (param_name->m_end == param_name->m_begin) {
    poVar4 = std::operator<<(ostr,"Usage: ");
    pbVar5 = unit_test::operator<<(poVar4,&this->m_program_name);
    std::operator<<(pbVar5," [Boost.Test argument]... ");
    if ((this->m_end_of_param_indicator)._M_string_length != 0) {
      poVar4 = std::operator<<(ostr,(string *)&this->m_end_of_param_indicator);
      std::operator<<(poVar4," [custom test module argument]...");
    }
    std::operator<<(ostr,"\n");
  }
  else {
    pmVar1 = std::
             map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
             ::operator[](&this->m_param_trie,(key_type *)help_prefix);
    local_f8.px = pmVar1->px;
    local_f8.pn.pi_ = (pmVar1->pn).pi_;
    if (local_f8.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_f8.pn.pi_)->use_count_ = (local_f8.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_d8.m_begin = param_name->m_begin;
    local_d8.m_end = param_name->m_end;
    local_b8.m_begin = "";
    sVar2 = unit_test::ut_detail::bcs_char_traits_impl<const_char>::length("");
    local_b8.m_end = "\t" + sVar2 + 1;
    locate_parameter(&local_a8,this,&local_f8,&local_d8,&local_b8);
    local_e8.px = local_a8.second.px;
    local_e8.pn.pi_ = local_a8.second.pn.pi_;
    local_a8.second.px = (element_type *)0x0;
    local_a8.second.pn.pi_ = (sp_counted_base *)0x0;
    std::pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>::
    ~pair(&local_a8);
    detail::shared_count::~shared_count(&local_f8.pn);
    pbVar3 = shared_ptr<boost::runtime::basic_param>::operator->(&local_e8);
    local_c8 = (this->m_negation_prefix)._M_dataplus._M_p;
    local_c0 = local_c8 + (this->m_negation_prefix)._M_string_length;
    (*pbVar3->_vptr_basic_param[5])(pbVar3,ostr);
    detail::shared_count::~shared_count(&local_e8.pn);
  }
  poVar4 = std::operator<<(ostr,"\nFor detailed help on Boost.Test parameters use:\n");
  poVar4 = std::operator<<(poVar4,"  ");
  pbVar5 = unit_test::operator<<(poVar4,&this->m_program_name);
  poVar4 = std::operator<<(pbVar5," --help\n");
  poVar4 = std::operator<<(poVar4,"or\n");
  poVar4 = std::operator<<(poVar4,"  ");
  pbVar5 = unit_test::operator<<(poVar4,&this->m_program_name);
  std::operator<<(pbVar5," --help=<parameter name>\n");
  return;
}

Assistant:

void
    usage( std::ostream& ostr, cstring param_name = cstring() )
    {
        if( !param_name.is_empty() ) {
            basic_param_ptr param = locate_parameter( m_param_trie[help_prefix], param_name, "" ).second;
            param->usage( ostr, m_negation_prefix );
        }
        else {
            ostr << "Usage: " << m_program_name << " [Boost.Test argument]... ";
            if( !m_end_of_param_indicator.empty() )
                ostr << m_end_of_param_indicator << " [custom test module argument]...";
            ostr << "\n";
        }

        ostr << "\nFor detailed help on Boost.Test parameters use:\n"
             << "  " << m_program_name << " --help\n"
             << "or\n"
             << "  " << m_program_name << " --help=<parameter name>\n";
    }